

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O1

_Bool is_bitmap_equal_to_array(roaring_bitmap_t *bitmap,uint32_t *vals,size_t numbers)

{
  _Bool _Var1;
  uint64_t uVar2;
  uint32_t *ans;
  
  uVar2 = roaring_bitmap_get_cardinality(bitmap);
  ans = (uint32_t *)malloc(uVar2 * 4);
  roaring_bitmap_to_uint32_array(bitmap,ans);
  _Var1 = array_equals(ans,(int32_t)uVar2,vals,(int32_t)numbers);
  free(ans);
  return _Var1;
}

Assistant:

bool is_bitmap_equal_to_array(roaring_bitmap_t *bitmap, uint32_t *vals,
                              size_t numbers) {
    uint64_t card;
    card = roaring_bitmap_get_cardinality(bitmap);
    uint32_t *arr = (uint32_t *)malloc(card * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(bitmap, arr);
    bool answer = array_equals(arr, card, vals, numbers);
    free(arr);
    return answer;
}